

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

VarSlice * __thiscall kratos::Var::operator[](Var *this,shared_ptr<kratos::Var> *var)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  Var *pVVar4;
  undefined1 auVar5 [8];
  int iVar6;
  shared_ptr<kratos::VarSlice> *s;
  pointer psVar7;
  Var *local_68;
  element_type *local_60;
  Var *local_58;
  vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
  *local_50;
  shared_ptr<kratos::Var> *local_48;
  undefined1 local_40 [8];
  shared_ptr<kratos::VarVarSlice> var_slice;
  
  local_50 = (vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
              *)&this->slices_;
  psVar7 = (this->slices_).
           super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->slices_).
           super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  local_48 = var;
  do {
    pVVar4 = local_58;
    if (psVar7 == psVar1) {
      local_68 = local_58;
      local_60 = (local_48->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::make_shared<kratos::VarVarSlice,kratos::Var*,kratos::Var*>((Var **)local_40,&local_68);
      std::
      vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
      emplace_back<std::shared_ptr<kratos::VarVarSlice>&>
                (local_50,(shared_ptr<kratos::VarVarSlice> *)local_40);
      if (pVVar4->width_param_ != (Var *)0x0) {
        (*(((VarSlice *)local_40)->super_Var).super_IRNode._vptr_IRNode[0x23])();
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_slice);
      return &((element_type *)local_40)->super_VarSlice;
    }
    iVar6 = (*(((psVar7->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Var).super_IRNode._vptr_IRNode[0x2b])();
    if ((char)iVar6 != '\0') {
      as<kratos::VarVarSlice>((Var *)local_40);
      auVar5 = local_40;
      peVar2 = *(Var **)((long)local_40 + 0x298);
      peVar3 = (local_48->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_slice);
      if (peVar2 == peVar3) {
        return &((element_type *)auVar5)->super_VarSlice;
      }
    }
    psVar7 = psVar7 + 1;
  } while( true );
}

Assistant:

VarSlice &Var::operator[](const std::shared_ptr<Var> &var) {
    // if there is one already
    for (auto const &s : slices_) {
        if (s->sliced_by_var()) {
            auto const s_ = s->as<VarVarSlice>();
            if (s_->sliced_var() == var.get()) return *s_;
        }
    }
    auto var_slice = ::make_shared<VarVarSlice>(this, var.get());
    slices_.emplace_back(var_slice);
    if (width_param_) {
        var_slice->set_width_param(width_param_);
    }
    return *var_slice;
}